

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_SetState(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AActor *this;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00430ab3;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00430aa3:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430ab3:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x2cd,
                  "int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_00430a23;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00430ab3;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_00430aa3;
LAB_00430a23:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x03') {
      pVVar1 = param + 1;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_00430a67;
        pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_00430a67:
          bVar2 = AActor::SetState(this,(FState *)(pVVar1->field_0).field_1.a,
                                   param[2].field_0.i != 0);
          if (numret < 1) {
            iVar3 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x2d0,
                            "int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,(uint)bVar2);
            iVar3 = 1;
          }
          return iVar3;
        }
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x2cf,
                    "int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar4 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x2ce,"int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SetState)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER(state, FState);
	PARAM_BOOL_DEF(nofunction);
	ACTION_RETURN_BOOL(self->SetState(state, nofunction));
}